

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O1

int run_container_negation_range_inplace
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  rle16_t *prVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  container_t *pcVar5;
  uint16_t uVar6;
  int unaff_EBP;
  ulong uVar7;
  uint uVar8;
  run_container_t *prVar9;
  uint in_R8D;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint16_t length;
  ushort uVar15;
  uint16_t uVar16;
  ushort start;
  ushort start_00;
  ulong uVar17;
  uint8_t return_typecode;
  byte local_49;
  run_container_t *local_48;
  ulong local_40;
  container_t **local_38;
  
  if (range_start < range_end) {
    iVar4 = src->n_runs;
    start_00 = (ushort)range_start;
    uVar15 = (ushort)range_end;
    local_48 = src;
    if (src->capacity == iVar4) {
      uVar11 = 0;
      uVar13 = 0;
      prVar9 = src;
      if (0 < range_start) {
        uVar8 = range_start - 1;
        prVar9 = (run_container_t *)(ulong)uVar8;
        prVar1 = src->runs;
        iVar14 = iVar4 + -1;
        uVar13 = 0;
        do {
          if (iVar14 < (int)uVar13) {
            uVar12 = ~uVar13;
            break;
          }
          uVar12 = uVar13 + iVar14 >> 1;
          if (prVar1[uVar12].value < (ushort)uVar8) {
            uVar13 = uVar12 + 1;
            bVar2 = true;
            uVar12 = in_R8D;
          }
          else if ((ushort)uVar8 < prVar1[uVar12].value) {
            iVar14 = uVar12 - 1;
            bVar2 = true;
            uVar12 = in_R8D;
          }
          else {
            bVar2 = false;
          }
          in_R8D = uVar12;
        } while (bVar2);
        uVar13 = 1;
        if (((int)uVar12 < 0) &&
           ((uVar12 == 0xffffffff ||
            (uVar8 = (uVar8 & 0xffff) - (uint)prVar1[-uVar12 - 2].value,
            prVar9 = (run_container_t *)(ulong)uVar8,
            (int)(uint)prVar1[-uVar12 - 2].length < (int)uVar8)))) {
          uVar13 = 0;
        }
      }
      prVar1 = src->runs;
      iVar4 = iVar4 + -1;
      iVar14 = iVar4;
      do {
        if (iVar14 < (int)uVar11) {
          uVar8 = ~uVar11;
          break;
        }
        uVar8 = uVar11 + iVar14 >> 1;
        if (prVar1[uVar8].value < start_00) {
          uVar11 = uVar8 + 1;
          bVar2 = true;
        }
        else if (start_00 < prVar1[uVar8].value) {
          iVar14 = uVar8 - 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          prVar9 = (run_container_t *)(ulong)uVar8;
        }
        uVar8 = (uint)prVar9;
      } while (bVar2);
      uVar11 = 1;
      if (((int)uVar8 < 0) &&
         ((uVar8 == 0xffffffff ||
          ((int)(uint)prVar1[-uVar8 - 2].length <
           (int)((range_start & 0xffffU) - (uint)prVar1[-uVar8 - 2].value))))) {
        uVar11 = 0;
      }
      bVar2 = true;
      if (uVar13 == uVar11) {
        uVar13 = range_end - 1;
        uVar8 = 0;
        iVar14 = iVar4;
        do {
          if (iVar14 < (int)uVar8) {
            uVar11 = ~uVar8;
            break;
          }
          uVar12 = uVar8 + iVar14 >> 1;
          if (prVar1[uVar12].value < (ushort)uVar13) {
            uVar8 = uVar12 + 1;
            bVar3 = true;
          }
          else if ((ushort)uVar13 < prVar1[uVar12].value) {
            iVar14 = uVar12 - 1;
            bVar3 = true;
          }
          else {
            bVar3 = false;
            uVar11 = uVar12;
          }
        } while (bVar3);
        iVar14 = 1;
        if (((int)uVar11 < 0) &&
           ((uVar11 == 0xffffffff ||
            (uVar13 = (uVar13 & 0xffff) - (uint)prVar1[-uVar11 - 2].value,
            (int)(uint)prVar1[-uVar11 - 2].length < (int)uVar13)))) {
          iVar14 = 0;
        }
        iVar10 = 0;
        if (range_end != 0x10000) {
          uVar11 = 0;
          do {
            if (iVar4 < (int)uVar11) {
              uVar13 = ~uVar11;
              break;
            }
            uVar8 = uVar11 + iVar4 >> 1;
            if (prVar1[uVar8].value < uVar15) {
              uVar11 = uVar8 + 1;
              bVar3 = true;
            }
            else if (uVar15 < prVar1[uVar8].value) {
              iVar4 = uVar8 - 1;
              bVar3 = true;
            }
            else {
              bVar3 = false;
              uVar13 = uVar8;
            }
          } while (bVar3);
          iVar10 = 1;
          if (((int)uVar13 < 0) &&
             ((uVar13 == 0xffffffff ||
              ((int)(uint)prVar1[-uVar13 - 2].length <
               (int)((range_end & 0xffffU) - (uint)prVar1[-uVar13 - 2].value))))) {
            iVar10 = 0;
          }
        }
        if (iVar10 == iVar14) {
          unaff_EBP = run_container_negation_range(src,range_start,range_end,dst);
          run_container_free(src);
          bVar2 = false;
        }
      }
      if (!bVar2) {
        return unaff_EBP;
      }
    }
    uVar11 = local_48->n_runs;
    local_40 = (ulong)uVar11;
    local_48->n_runs = 0;
    if ((int)uVar11 < 1) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        start = local_48->runs[uVar7].value;
        if (range_start <= (int)(uint)start) {
          length = local_48->runs[uVar7].length;
          goto LAB_0011ea51;
        }
        local_48->n_runs = local_48->n_runs + 1;
        uVar7 = uVar7 + 1;
      } while (local_40 != uVar7);
      uVar7 = (ulong)uVar11;
    }
    start = 0;
    length = 0;
LAB_0011ea51:
    local_38 = dst;
    run_container_smart_append_exclusive(local_48,start_00,~start_00 + uVar15);
    if ((int)uVar7 < (int)local_40) {
      uVar17 = uVar7 & 0xffffffff;
      uVar6 = 0;
      uVar16 = 0;
      do {
        uVar11 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar11;
        if ((int)uVar11 < (int)local_40) {
          uVar6 = local_48->runs[uVar17 + 1].value;
          uVar16 = local_48->runs[uVar17 + 1].length;
        }
        run_container_smart_append_exclusive(local_48,start,length);
        uVar17 = uVar17 + 1;
        start = uVar6;
        length = uVar16;
      } while ((int)uVar11 < (int)local_40);
    }
    prVar9 = local_48;
    pcVar5 = convert_run_to_efficient_container(local_48,&local_49);
    *local_38 = pcVar5;
    if (local_49 != 3) {
      run_container_free(prVar9);
    }
    uVar11 = (uint)local_49;
  }
  else {
    *dst = src;
    uVar11 = 3;
  }
  return uVar11;
}

Assistant:

int run_container_negation_range_inplace(run_container_t *src,
                                         const int range_start,
                                         const int range_end,
                                         container_t **dst) {
    uint8_t return_typecode;

    if (range_end <= range_start) {
        *dst = src;
        return RUN_CONTAINER_TYPE;
    }

    // TODO: efficient special case when range is 0 to 65535 inclusive

    if (src->capacity == src->n_runs) {
        // no excess room.  More checking to see if result can fit
        bool last_val_before_range = false;
        bool first_val_in_range = false;
        bool last_val_in_range = false;
        bool first_val_past_range = false;

        if (range_start > 0)
            last_val_before_range =
                run_container_contains(src, (uint16_t)(range_start - 1));
        first_val_in_range = run_container_contains(src, (uint16_t)range_start);

        if (last_val_before_range == first_val_in_range) {
            last_val_in_range =
                run_container_contains(src, (uint16_t)(range_end - 1));
            if (range_end != 0x10000)
                first_val_past_range =
                    run_container_contains(src, (uint16_t)range_end);

            if (last_val_in_range ==
                first_val_past_range) {  // no space for inplace
                int ans = run_container_negation_range(src, range_start,
                                                       range_end, dst);
                run_container_free(src);
                return ans;
            }
        }
    }
    // all other cases: result will fit

    run_container_t *ans = src;
    int my_nbr_runs = src->n_runs;

    ans->n_runs = 0;
    int k = 0;
    for (; (k < my_nbr_runs) && (src->runs[k].value < range_start); ++k) {
        // ans->runs[k] = src->runs[k]; (would be self-copy)
        ans->n_runs++;
    }

    // as with Java implementation, use locals to give self a buffer of depth 1
    rle16_t buffered = CROARING_MAKE_RLE16(0, 0);
    rle16_t next = buffered;
    if (k < my_nbr_runs) buffered = src->runs[k];

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < my_nbr_runs; ++k) {
        if (k + 1 < my_nbr_runs) next = src->runs[k + 1];

        run_container_smart_append_exclusive(ans, buffered.value,
                                             buffered.length);
        buffered = next;
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}